

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

value_type * __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>::
update(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
       *this,char_range key)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  type *node_id_00;
  type_conflict *ptVar5;
  reference pvVar6;
  value_type_conflict7 *pvVar7;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  plain_bonsai_nlm<int> *in_RDI;
  pair<const_int_*,_unsigned_long> pVar8;
  int *vptr;
  type_conflict *match;
  type *vptr_1;
  uint64_t node_id;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
  *in_stack_fffffffffffffd78;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
  *in_stack_fffffffffffffd80;
  uint64_t in_stack_fffffffffffffd98;
  char_range *in_stack_fffffffffffffda0;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_fffffffffffffda8;
  char_range *local_248;
  uint64_t in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
  *this_00;
  uint64_t in_stack_fffffffffffffe70;
  uint32_t in_stack_fffffffffffffe7c;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
  *in_stack_fffffffffffffe80;
  char_range local_18;
  value_type_conflict7 *local_8;
  
  local_18.begin = in_RSI;
  local_18.end = in_RDX;
  bVar2 = char_range::empty(&local_18);
  if (bVar2) {
    uVar3 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffd80,&in_stack_fffffffffffffd78->is_ready_);
    __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
  }
  if (local_18.end[-1] != '\0') {
    uVar3 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffd80,&in_stack_fffffffffffffd78->is_ready_);
    __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
  }
  uVar4 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::size
                    ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)
                     &(in_RDI->ptrs_).
                      super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (uVar4 == 0) {
    if (((ulong)(in_RDI->ptrs_).
                super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start & 1) == 0) {
      map(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
      operator=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      ~map(in_stack_fffffffffffffd80);
    }
    in_RDI[10].ptrs_.
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((in_RDI[10].ptrs_.
                            super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1);
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_root
              ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)
               &(in_RDI->ptrs_).
                super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::get_root
              ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)
               &(in_RDI->ptrs_).
                super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_8 = plain_bonsai_nlm<int>::insert
                        (in_RDI,(uint64_t)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  }
  else {
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::get_root
              ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)
               &(in_RDI->ptrs_).
                super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while (bVar2 = char_range::empty(&local_18), ((bVar2 ^ 0xffU) & 1) != 0) {
      pVar8 = plain_bonsai_nlm<int>::compare
                        ((plain_bonsai_nlm<int> *)
                         CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                         in_stack_fffffffffffffdc8,local_248);
      node_id_00 = std::get<0ul,int_const*,unsigned_long>
                             ((pair<const_int_*,_unsigned_long> *)0x1d20e4);
      ptVar5 = std::get<1ul,int_const*,unsigned_long>((pair<const_int_*,_unsigned_long> *)0x1d20f3);
      if (*node_id_00 != (type)0x0) {
        return *node_id_00;
      }
      local_18.begin = local_18.begin + *ptVar5;
      while (this_00 = (map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                        *)pVar8.first,
            (in_RDI->ptrs_).
            super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish <= (pointer)*ptVar5) {
        bVar2 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                          (in_stack_fffffffffffffda8,(uint64_t *)in_stack_fffffffffffffda0,
                           in_stack_fffffffffffffd98);
        if (bVar2) {
          expand_if_needed_((map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                             *)pVar8.first,(uint64_t *)node_id_00);
        }
        *ptVar5 = *ptVar5 - (long)(in_RDI->ptrs_).
                                  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      pvVar6 = std::array<unsigned_char,_256UL>::operator[]
                         ((array<unsigned_char,_256UL> *)in_stack_fffffffffffffd80,
                          (size_type)in_stack_fffffffffffffd78);
      if (*pvVar6 == 0xff) {
        iVar1 = *(int *)&in_RDI[10].ptrs_.
                         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
        *(int *)&in_RDI[10].ptrs_.
                 super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish = iVar1 + 1;
        pvVar6 = std::array<unsigned_char,_256UL>::operator[]
                           ((array<unsigned_char,_256UL> *)in_stack_fffffffffffffd80,
                            (size_type)in_stack_fffffffffffffd78);
        *pvVar6 = (value_type_conflict3)iVar1;
        in_stack_fffffffffffffdd7 = 0;
        if (*(int *)&in_RDI[10].ptrs_.
                     super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish == 0xff) {
          uVar3 = __cxa_allocate_exception(0x10);
          exception::exception
                    ((exception *)in_stack_fffffffffffffd80,&in_stack_fffffffffffffd78->is_ready_);
          __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
        }
      }
      in_stack_fffffffffffffd80 =
           (map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
            *)&(in_RDI->ptrs_).
               super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      make_symb_(in_stack_fffffffffffffd80,(uint8_t)((ulong)in_stack_fffffffffffffd78 >> 0x38),
                 0x1d22ae);
      bVar2 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                        (in_stack_fffffffffffffda8,(uint64_t *)in_stack_fffffffffffffda0,
                         in_stack_fffffffffffffd98);
      if (bVar2) {
        expand_if_needed_(this_00,(uint64_t *)node_id_00);
        local_18.begin = local_18.begin + 1;
        in_RDI[10].ptrs_.
        super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&((in_RDI[10].ptrs_.
                                super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1);
        pvVar7 = plain_bonsai_nlm<int>::insert
                           (in_RDI,(uint64_t)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        return pvVar7;
      }
      local_18.begin = local_18.begin + 1;
    }
    pVar8 = plain_bonsai_nlm<int>::compare
                      ((plain_bonsai_nlm<int> *)
                       CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                       in_stack_fffffffffffffdc8,local_248);
    local_248 = (char_range *)pVar8.first;
    local_8 = (value_type_conflict7 *)local_248;
    if (local_248 == (char_range *)0x0) {
      local_8 = (value_type_conflict7 *)0x0;
    }
  }
  return local_8;
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }